

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O2

int txfm_partition_context
              (TXFM_CONTEXT *above_ctx,TXFM_CONTEXT *left_ctx,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  byte bVar4;
  byte bVar5;
  TX_SIZE TVar6;
  
  iVar1 = (int)CONCAT71(in_register_00000009,tx_size);
  uVar2 = (ulong)(uint)(iVar1 * 4);
  if (iVar1 == 0) {
    return 0;
  }
  bVar4 = block_size_high[bsize];
  if (block_size_high[bsize] < block_size_wide[bsize]) {
    bVar4 = block_size_wide[bsize];
  }
  if (bVar4 == 8) {
    TVar6 = '\x01';
    bVar5 = 0;
  }
  else {
    bVar5 = 1;
    if (bVar4 == 0x10) {
      TVar6 = '\x02';
    }
    else {
      TVar6 = '\x04';
      if ((bVar4 != 0x80) && (bVar4 != 0x40)) {
        if (bVar4 != 0x20) {
          uVar3 = 0x3f;
          goto LAB_00210f09;
        }
        TVar6 = '\x03';
      }
    }
  }
  uVar3 = (uint)(byte)(((""[CONCAT71(in_register_00000009,tx_size) & 0xffffffff] != TVar6 & bVar5) +
                       TVar6 * -2) * '\x03' + 0x18);
LAB_00210f09:
  return (uint)(*left_ctx < *(byte *)((long)tx_size_high + uVar2)) +
         (uint)(*above_ctx < *(byte *)((long)tx_size_wide + uVar2)) + uVar3;
}

Assistant:

static inline int txfm_partition_context(const TXFM_CONTEXT *const above_ctx,
                                         const TXFM_CONTEXT *const left_ctx,
                                         BLOCK_SIZE bsize, TX_SIZE tx_size) {
  const uint8_t txw = tx_size_wide[tx_size];
  const uint8_t txh = tx_size_high[tx_size];
  const int above = *above_ctx < txw;
  const int left = *left_ctx < txh;
  int category = TXFM_PARTITION_CONTEXTS;

  // dummy return, not used by others.
  if (tx_size <= TX_4X4) return 0;

  TX_SIZE max_tx_size =
      get_sqr_tx_size(AOMMAX(block_size_wide[bsize], block_size_high[bsize]));

  if (max_tx_size >= TX_8X8) {
    category =
        (txsize_sqr_up_map[tx_size] != max_tx_size && max_tx_size > TX_8X8) +
        (TX_SIZES - 1 - max_tx_size) * 2;
  }
  assert(category != TXFM_PARTITION_CONTEXTS);
  return category * 3 + above + left;
}